

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O3

Snapshot * __thiscall
cmState::CreateBuildsystemDirectorySnapshot
          (Snapshot *__return_storage_ptr__,cmState *this,Snapshot originSnapshot,
          string *entryPointCommand,long entryPointLine)

{
  PositionType *this_00;
  pointer *ppSVar1;
  cmLinkedTree<cmState::PolicyStackEntry> *pcVar2;
  cmLinkedTree<cmDefinitions> *pcVar3;
  PositionType PVar4;
  iterator __position;
  PositionType PVar5;
  cmLinkedTree<cmState::SnapshotDataType> *pcVar6;
  iterator it;
  bool bVar7;
  PointerType pSVar8;
  PointerType pBVar9;
  PointerType pSVar10;
  iterator iVar11;
  iterator iVar12;
  iterator iVar13;
  iterator local_40;
  
  bVar7 = Snapshot::IsValid(&originSnapshot);
  if (!bVar7) {
    __assert_fail("originSnapshot.IsValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmState.cxx"
                  ,0x354,
                  "cmState::Snapshot cmState::CreateBuildsystemDirectorySnapshot(Snapshot, const std::string &, long)"
                 );
  }
  this_00 = &originSnapshot.Position;
  it.Position = originSnapshot.Position.Position;
  it.Tree = originSnapshot.Position.Tree;
  local_40 = cmLinkedTree<cmState::SnapshotDataType>::Push(&this->SnapshotData,it);
  pSVar8 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_40);
  pSVar8->EntryPointLine = entryPointLine;
  pSVar8 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_40);
  std::__cxx11::string::_M_assign((string *)&pSVar8->EntryPointCommand);
  pSVar8 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_40);
  (pSVar8->DirectoryParent).Tree = originSnapshot.Position.Tree;
  (pSVar8->DirectoryParent).Position = originSnapshot.Position.Position;
  pSVar8 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_40);
  (pSVar8->ScopeParent).Tree = originSnapshot.Position.Tree;
  (pSVar8->ScopeParent).Position = originSnapshot.Position.Position;
  pSVar8 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_40);
  pSVar8->SnapshotType = BuildsystemDirectoryType;
  pSVar8 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_40);
  pSVar8->Keep = true;
  pSVar8 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(this_00);
  iVar11 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::Push
                     (&this->BuildsystemDirectory,pSVar8->BuildSystemDirectory);
  pSVar8 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_40);
  pSVar8->BuildSystemDirectory = iVar11;
  pSVar8 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(this_00);
  iVar12 = cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::Push(&this->ExecutionListFiles,pSVar8->ExecutionListFile);
  pSVar8 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_40);
  pSVar8->ExecutionListFile = iVar12;
  pSVar8 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_40);
  pBVar9 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar8->BuildSystemDirectory);
  (pBVar9->DirectoryEnd).Tree = local_40.Tree;
  (pBVar9->DirectoryEnd).Position = local_40.Position;
  pSVar8 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(this_00);
  pSVar10 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_40);
  PVar5 = (pSVar8->Policies).Position;
  (pSVar10->Policies).Tree = (pSVar8->Policies).Tree;
  (pSVar10->Policies).Position = PVar5;
  pSVar8 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(this_00);
  pSVar10 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_40);
  PVar5 = (pSVar8->Policies).Position;
  (pSVar10->PolicyRoot).Tree = (pSVar8->Policies).Tree;
  (pSVar10->PolicyRoot).Position = PVar5;
  pSVar8 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(this_00);
  pSVar10 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_40);
  PVar5 = (pSVar8->Policies).Position;
  (pSVar10->PolicyScope).Tree = (pSVar8->Policies).Tree;
  (pSVar10->PolicyScope).Position = PVar5;
  pSVar8 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_40);
  pcVar2 = (pSVar8->Policies).Tree;
  if ((pcVar2 != (cmLinkedTree<cmState::PolicyStackEntry> *)0x0) &&
     ((pSVar8->Policies).Position <=
      (ulong)(((long)(pcVar2->Data).
                     super__Vector_base<cmState::PolicyStackEntry,_std::allocator<cmState::PolicyStackEntry>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(pcVar2->Data).
                     super__Vector_base<cmState::PolicyStackEntry,_std::allocator<cmState::PolicyStackEntry>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333))) {
    pSVar8 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_40);
    pcVar2 = (pSVar8->PolicyRoot).Tree;
    if ((pcVar2 != (cmLinkedTree<cmState::PolicyStackEntry> *)0x0) &&
       ((pSVar8->PolicyRoot).Position <=
        (ulong)(((long)(pcVar2->Data).
                       super__Vector_base<cmState::PolicyStackEntry,_std::allocator<cmState::PolicyStackEntry>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(pcVar2->Data).
                       super__Vector_base<cmState::PolicyStackEntry,_std::allocator<cmState::PolicyStackEntry>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333))) {
      pSVar8 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(this_00);
      pcVar3 = (pSVar8->Vars).Tree;
      PVar4 = (pSVar8->Vars).Position;
      iVar13 = pSVar8->Vars;
      pSVar8 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_40);
      (pSVar8->Parent).Tree = pcVar3;
      (pSVar8->Parent).Position = PVar4;
      pSVar8 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_40);
      (pSVar8->Root).Tree = pcVar3;
      (pSVar8->Root).Position = PVar4;
      iVar13 = cmLinkedTree<cmDefinitions>::Push(&this->VarTree,iVar13);
      pSVar8 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_40);
      pSVar8->Vars = iVar13;
      __return_storage_ptr__->State = this;
      (__return_storage_ptr__->Position).Tree = local_40.Tree;
      (__return_storage_ptr__->Position).Position = local_40.Position;
      pSVar8 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(this_00);
      pBVar9 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                         (&pSVar8->BuildSystemDirectory);
      __position._M_current =
           (pBVar9->Children).
           super__Vector_base<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (pBVar9->Children).
          super__Vector_base<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<cmState::Snapshot,std::allocator<cmState::Snapshot>>::
        _M_realloc_insert<cmState::Snapshot_const&>
                  ((vector<cmState::Snapshot,std::allocator<cmState::Snapshot>> *)&pBVar9->Children,
                   __position,__return_storage_ptr__);
      }
      else {
        ((__position._M_current)->Position).Position = (__return_storage_ptr__->Position).Position;
        pcVar6 = (__return_storage_ptr__->Position).Tree;
        (__position._M_current)->State = __return_storage_ptr__->State;
        ((__position._M_current)->Position).Tree = pcVar6;
        ppSVar1 = &(pBVar9->Children).
                   super__Vector_base<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>._M_impl
                   .super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + 1;
      }
      Snapshot::SetDefaultDefinitions(__return_storage_ptr__);
      Snapshot::InitializeFromParent(__return_storage_ptr__);
      Snapshot::SetDirectoryDefinitions(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    __assert_fail("pos->PolicyRoot.IsValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmState.cxx"
                  ,0x367,
                  "cmState::Snapshot cmState::CreateBuildsystemDirectorySnapshot(Snapshot, const std::string &, long)"
                 );
  }
  __assert_fail("pos->Policies.IsValid()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmState.cxx"
                ,0x366,
                "cmState::Snapshot cmState::CreateBuildsystemDirectorySnapshot(Snapshot, const std::string &, long)"
               );
}

Assistant:

cmState::Snapshot
cmState::CreateBuildsystemDirectorySnapshot(Snapshot originSnapshot,
                                    std::string const& entryPointCommand,
                                    long entryPointLine)
{
  assert(originSnapshot.IsValid());
  PositionType pos = this->SnapshotData.Push(originSnapshot.Position);
  pos->EntryPointLine = entryPointLine;
  pos->EntryPointCommand = entryPointCommand;
  pos->DirectoryParent = originSnapshot.Position;
  pos->ScopeParent = originSnapshot.Position;
  pos->SnapshotType = BuildsystemDirectoryType;
  pos->Keep = true;
  pos->BuildSystemDirectory =
      this->BuildsystemDirectory.Push(
        originSnapshot.Position->BuildSystemDirectory);
  pos->ExecutionListFile =
      this->ExecutionListFiles.Push(
        originSnapshot.Position->ExecutionListFile);
  pos->BuildSystemDirectory->DirectoryEnd = pos;
  pos->Policies = originSnapshot.Position->Policies;
  pos->PolicyRoot = originSnapshot.Position->Policies;
  pos->PolicyScope = originSnapshot.Position->Policies;
  assert(pos->Policies.IsValid());
  assert(pos->PolicyRoot.IsValid());

  cmLinkedTree<cmDefinitions>::iterator origin =
      originSnapshot.Position->Vars;
  pos->Parent = origin;
  pos->Root = origin;
  pos->Vars = this->VarTree.Push(origin);

  cmState::Snapshot snapshot = cmState::Snapshot(this, pos);
  originSnapshot.Position->BuildSystemDirectory->Children.push_back(snapshot);
  snapshot.SetDefaultDefinitions();
  snapshot.InitializeFromParent();
  snapshot.SetDirectoryDefinitions();
  return snapshot;
}